

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

Complex __thiscall rtb::Filter::Polynomial<double>::solveFor(Polynomial<double> *this,Complex value)

{
  pointer pcVar1;
  complex<double> *in_RAX;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  ulong uVar3;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined8 in_XMM1_Qa;
  double dVar4;
  Complex CVar5;
  double local_78;
  double dStack_70;
  undefined8 local_60;
  undefined8 local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  uVar2 = value._M_value._8_8_;
  local_60._4_4_ = in_XMM0_Db;
  local_60._0_4_ = in_XMM0_Da;
  if (this->size_ != 0) {
    dVar4 = 0.0;
    uVar3 = 0;
    local_50 = 0.0;
    local_58 = in_XMM1_Qa;
    do {
      pcVar1 = (this->coefficients_).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_48 = dVar4;
      if ((ulong)((long)(this->coefficients_).
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) <= uVar3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3
                  );
      }
      local_78 = (double)local_60;
      dStack_70 = (double)local_58;
      local_40 = (double)uVar3;
      std::pow<double>((complex<double> *)&local_78,&local_40);
      pcVar1 = pcVar1 + uVar3;
      local_78 = *(double *)pcVar1->_M_value;
      dStack_70 = *(double *)(pcVar1->_M_value + 8);
      local_38 = dVar4;
      in_RAX = std::complex<double>::operator*=
                         ((complex<double> *)&local_78,(complex<double> *)&local_40);
      local_50 = local_50 + local_78;
      dVar4 = local_48 + dStack_70;
      uVar3 = (ulong)((int)uVar3 + 1);
      uVar2 = extraout_RDX;
    } while (uVar3 < this->size_);
  }
  CVar5._M_value._8_8_ = uVar2;
  CVar5._M_value._0_8_ = in_RAX;
  return (Complex)CVar5._M_value;
}

Assistant:

typename Polynomial<T>::Complex Polynomial<T>::solveFor(Complex value) const {

            Complex r{ 0 };
            for (unsigned i{ 0 }; i < size_; ++i)
                r += coefficients_.at(i)*std::pow(value, i);
            return r;
        }